

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O2

output_type __thiscall
testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::generate
          (Arbitrary<std::forward_list<int,_std::allocator<int>_>_> *this,size_t generation,
          unsigned_long randomSeed)

{
  anon_class_16_2_2856ea55 __gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  *(undefined8 *)this = 0;
  if (generation != 0) {
    __gen.randomSeed = &randomSeed_local;
    __gen.generation = &generation_local;
    randomSeed_local = randomSeed;
    generation_local = generation;
    ::std::
    generate_n<std::front_insert_iterator<std::forward_list<int,std::allocator<int>>>,unsigned_long,testinator::Arbitrary<std::forward_list<int,std::allocator<int>>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              ((front_insert_iterator<std::forward_list<int,_std::allocator<int>_>_>)this,
               (generation / 100) * 5 + 5,__gen);
  }
  return (_Fwd_list_base<int,_std::allocator<int>_>)(_Fwd_list_base<int,_std::allocator<int>_>)this;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::size_t n = N * ((generation / 100) + 1);
      std::generate_n(std::front_inserter(v), n,
                      [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }